

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O1

Vector<int,_3,_true> __thiscall
Nova::Vector<int,_4,_true>::Remove_Index(Vector<int,_4,_true> *this,int index)

{
  ulong uVar1;
  uint in_EDX;
  undefined8 uVar2;
  undefined4 in_register_00000034;
  long lVar3;
  undefined8 uVar4;
  Vector<int,_3,_true> VVar5;
  
  if (3 < in_EDX) {
    __assert_fail("index>=0 && index<d",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Geometry/../Tools/include/nova/Tools/Vectors/Vector.h"
                  ,0x1d2,
                  "Vector<T, d - 1> Nova::Vector<int, 4>::Remove_Index(const int) const [T = int, d = 4, order_ascending = true]"
                 );
  }
  (this->_data)._M_elems[2] = 0;
  (this->_data)._M_elems[0] = 0;
  (this->_data)._M_elems[1] = 0;
  if (in_EDX != 0) {
    uVar1 = 0;
    do {
      if (uVar1 == 3) {
        uVar2 = 3;
        uVar4 = 3;
        goto LAB_0010cef3;
      }
      (this->_data)._M_elems[uVar1] = *(int *)(CONCAT44(in_register_00000034,index) + uVar1 * 4);
      uVar1 = uVar1 + 1;
    } while (in_EDX != uVar1);
    if (in_EDX == 3) goto LAB_0010ced1;
  }
  lVar3 = (ulong)in_EDX + 1;
  do {
    if (lVar3 == 4) {
      uVar2 = 4;
      uVar4 = 4;
LAB_0010cef3:
      std::__throw_out_of_range_fmt
                ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar4,uVar2);
    }
    (this->_data)._M_elems[lVar3 + -1] = *(int *)(CONCAT44(in_register_00000034,index) + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
LAB_0010ced1:
  VVar5._data._M_elems[2] = in_EDX;
  VVar5._data._M_elems._0_8_ = this;
  return (Vector<int,_3,_true>)VVar5._data._M_elems;
}

Assistant:

Vector<T,d-1> Remove_Index(const int index) const
    {
        assert(index>=0 && index<d);
        Vector<T,d-1> ret;
        for(int i=0;i<index;++i) ret[i]=(*this)[i];
        for(int i=index+1;i<d;++i) ret[i-1]=(*this)[i];
        return ret;
    }